

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTUINTDec(octet *val,size_t *len,octet *der,size_t count,u32 tag)

{
  long lVar1;
  long *in_RSI;
  void *in_RDI;
  size_t ex;
  size_t l;
  octet *v;
  undefined4 in_stack_ffffffffffffffa8;
  u32 in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool bVar2;
  octet *in_stack_ffffffffffffffb8;
  size_t *in_stack_ffffffffffffffc0;
  octet **in_stack_ffffffffffffffc8;
  size_t local_8;
  
  local_8 = derDec2(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                    CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
  if (local_8 == 0xffffffffffffffff) {
    local_8 = 0xffffffffffffffff;
  }
  else if (((in_stack_ffffffffffffffc0 == (size_t *)0x0) ||
           (((ulong)*in_stack_ffffffffffffffc8 & 0x80) != 0)) ||
          ((*(byte *)in_stack_ffffffffffffffc8 == 0 &&
           (((size_t *)0x1 < in_stack_ffffffffffffffc0 &&
            (((ulong)*in_stack_ffffffffffffffc8 & 0x8000) == 0)))))) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    bVar2 = false;
    if ((*(byte *)in_stack_ffffffffffffffc8 == 0) &&
       (bVar2 = false, (size_t *)0x1 < in_stack_ffffffffffffffc0)) {
      bVar2 = ((ulong)*in_stack_ffffffffffffffc8 & 0x8000) != 0;
    }
    lVar1 = (long)(int)(uint)(bVar2 != false);
    if (in_RDI != (void *)0x0) {
      memMove((void *)CONCAT17(bVar2,in_stack_ffffffffffffffb0),
              (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0x117b5d);
      memRev(in_RDI,(long)in_stack_ffffffffffffffc0 - lVar1);
    }
    if (in_RSI != (long *)0x0) {
      *in_RSI = (long)in_stack_ffffffffffffffc0 - lVar1;
    }
  }
  return local_8;
}

Assistant:

size_t derTUINTDec(octet* val, size_t* len, const octet der[], size_t count,
	u32 tag)
{
	const octet* v;
	size_t l;
	size_t ex;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// в значении менее одного октета?
	// установлен старший бит в первом (старшем) октете?
	// незначащий нулевой октет?
	if (l < 1 || (v[0] & 128) ||
		v[0] == 0 && l > 1 && !(v[1] & 128))
		return SIZE_MAX;
	// дополнительный нулевой октет?
	ex = (v[0] == 0 && l > 1 && (v[1] & 128)) ? 1 : 0;
	// возвратить значение
	if (val)
	{
		ASSERT(memIsValid(val, l - ex));
		ASSERT(len == 0 || memIsDisjoint2(len, O_PER_S, val, l - ex));
		memMove(val, v + ex, l - ex);
		memRev(val, l - ex);
	}
	// возвратить длину
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		*len = l - ex;
	}
	return count;
}